

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

ostream * __thiscall wasm::String::printEscaped(String *this,ostream *os,string_view str)

{
  byte bVar1;
  const_iterator pvVar2;
  ostream *poVar3;
  void *pvVar4;
  uchar c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  ostream *os_local;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  os_local = os;
  std::operator<<((ostream *)this,'\"');
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&os_local);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&os_local);
  for (; __end2 != pvVar2; __end2 = __end2 + 1) {
    bVar1 = *__end2;
    if (bVar1 == 9) {
      std::operator<<((ostream *)this,"\\t");
    }
    else if (bVar1 == 10) {
      std::operator<<((ostream *)this,"\\n");
    }
    else if (bVar1 == 0xd) {
      std::operator<<((ostream *)this,"\\r");
    }
    else if (bVar1 == 0x22) {
      std::operator<<((ostream *)this,"\\\"");
    }
    else if (bVar1 == 0x27) {
      std::operator<<((ostream *)this,"\\\'");
    }
    else if (bVar1 == 0x5c) {
      std::operator<<((ostream *)this,"\\\\");
    }
    else if ((bVar1 < 0x20) || (0x7e < bVar1)) {
      poVar3 = (ostream *)std::ostream::operator<<(this,std::hex);
      poVar3 = std::operator<<(poVar3,'\\');
      pvVar4 = (void *)std::ostream::operator<<(poVar3,bVar1 / 0x10);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,(uint)bVar1 % 0x10);
      std::ostream::operator<<(pvVar4,std::dec);
    }
    else {
      std::operator<<((ostream *)this,bVar1);
    }
  }
  poVar3 = std::operator<<((ostream *)this,'\"');
  return poVar3;
}

Assistant:

std::ostream& printEscaped(std::ostream& os, std::string_view str) {
  os << '"';
  for (unsigned char c : str) {
    switch (c) {
      case '\t':
        os << "\\t";
        break;
      case '\n':
        os << "\\n";
        break;
      case '\r':
        os << "\\r";
        break;
      case '"':
        os << "\\\"";
        break;
      case '\'':
        os << "\\'";
        break;
      case '\\':
        os << "\\\\";
        break;
      default: {
        if (c >= 32 && c < 127) {
          os << c;
        } else {
          os << std::hex << '\\' << (c / 16) << (c % 16) << std::dec;
        }
      }
    }
  }
  return os << '"';
}